

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O3

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  stbi_uc *psVar1;
  ushort uVar2;
  byte *pbVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char cVar25;
  stbi__uint16 sVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  stbi_uc *psVar35;
  stbi__uint16 *data;
  stbi_uc *psVar36;
  ulong uVar37;
  stbi_uc *psVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  byte bVar44;
  stbi_uc sVar45;
  uint y_00;
  stbi__uint16 *psVar46;
  stbi__uint16 *psVar47;
  uint x_00;
  byte *pbVar48;
  stbi__uint16 *psVar49;
  uint uVar50;
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  int iVar122;
  float fVar123;
  int iVar131;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  int iVar132;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  stbi__uint16 *local_68;
  
  iVar27 = stbi__get16be(s);
  uVar28 = stbi__get16be(s);
  if ((uVar28 | iVar27 << 0x10) != 0x38425053) {
    stbi__g_failure_reason = "not PSD";
    return (void *)0x0;
  }
  iVar27 = stbi__get16be(s);
  if (iVar27 != 1) {
    stbi__g_failure_reason = "wrong version";
    return (void *)0x0;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar35 = s->img_buffer;
  }
  else {
    psVar35 = s->img_buffer;
    iVar27 = (int)s->img_buffer_end - (int)psVar35;
    if (iVar27 < 6) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar27);
      goto LAB_001120d4;
    }
  }
  s->img_buffer = psVar35 + 6;
LAB_001120d4:
  uVar28 = stbi__get16be(s);
  if (uVar28 < 0x11) {
    iVar27 = stbi__get16be(s);
    uVar29 = stbi__get16be(s);
    iVar30 = stbi__get16be(s);
    uVar31 = stbi__get16be(s);
    iVar32 = stbi__get16be(s);
    if ((iVar32 == 8) || (iVar32 == 0x10)) {
      iVar33 = stbi__get16be(s);
      if (iVar33 == 3) {
        iVar33 = stbi__get16be(s);
        uVar34 = stbi__get16be(s);
        stbi__skip(s,iVar33 << 0x10 | uVar34);
        iVar33 = stbi__get16be(s);
        uVar34 = stbi__get16be(s);
        stbi__skip(s,iVar33 << 0x10 | uVar34);
        iVar33 = stbi__get16be(s);
        uVar34 = stbi__get16be(s);
        stbi__skip(s,iVar33 << 0x10 | uVar34);
        uVar34 = stbi__get16be(s);
        if (uVar34 < 2) {
          uVar39 = iVar27 * 0x10000;
          y_00 = uVar39 + uVar29;
          uVar40 = iVar30 * 0x10000;
          x_00 = uVar40 + uVar31;
          iVar27 = stbi__mad3sizes_valid(4,x_00,y_00,0);
          if (iVar27 == 0) {
            stbi__g_failure_reason = "too large";
          }
          else {
            if (((bpc == 0x10) && (iVar32 == 0x10)) && (uVar34 == 0)) {
              data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,y_00,0);
              ri->bits_per_channel = 0x10;
            }
            else {
              data = (stbi__uint16 *)malloc((long)(int)(y_00 * x_00 * 4));
            }
            if (data != (stbi__uint16 *)0x0) {
              uVar41 = x_00 * y_00;
              if (uVar34 == 0) {
                psVar35 = s->buffer_start;
                psVar1 = s->buffer_start + 1;
                lVar42 = (ulong)((uVar29 | uVar39) * (uVar31 | uVar40)) - 1;
                auVar58._8_4_ = (int)lVar42;
                auVar58._0_8_ = lVar42;
                auVar58._12_4_ = (int)((ulong)lVar42 >> 0x20);
                psVar46 = data + 0x1e;
                uVar34 = (uVar29 + uVar39) * (uVar31 + uVar40);
                psVar49 = data + 0x1c;
                uVar37 = 0;
                psVar47 = data;
                auVar142 = _DAT_001420f0;
                local_68 = data;
                do {
                  if (uVar37 < uVar28) {
                    if (ri->bits_per_channel == 0x10) {
                      if (0 < (int)uVar41) {
                        lVar42 = 0;
                        do {
                          iVar27 = stbi__get16be(s);
                          auVar142 = _DAT_001420f0;
                          local_68[lVar42 * 4] = (stbi__uint16)iVar27;
                          lVar42 = lVar42 + 1;
                        } while (uVar34 != (uint)lVar42);
                      }
                    }
                    else if (iVar32 == 0x10) {
                      if (0 < (int)uVar41) {
                        lVar42 = 0;
                        do {
                          iVar27 = stbi__get16be(s);
                          auVar142 = _DAT_001420f0;
                          *(char *)(psVar47 + lVar42 * 2) = (char)((uint)iVar27 >> 8);
                          lVar42 = lVar42 + 1;
                        } while (uVar34 != (uint)lVar42);
                      }
                    }
                    else if (0 < (int)uVar41) {
                      psVar36 = s->img_buffer;
                      psVar38 = s->img_buffer_end;
                      lVar42 = 0;
                      do {
                        if (psVar36 < psVar38) {
                          s->img_buffer = psVar36 + 1;
                          sVar45 = *psVar36;
                          psVar36 = psVar36 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          sVar45 = '\0';
                        }
                        else {
                          iVar27 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                          if (iVar27 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            sVar45 = '\0';
                            psVar38 = psVar1;
                          }
                          else {
                            sVar45 = *psVar35;
                            psVar38 = psVar35 + iVar27;
                          }
                          auVar142 = _DAT_001420f0;
                          s->img_buffer_end = psVar38;
                          s->img_buffer = psVar1;
                          psVar36 = psVar1;
                        }
                        *(stbi_uc *)(psVar47 + lVar42 * 2) = sVar45;
                        lVar42 = lVar42 + 1;
                      } while (uVar34 != (uint)lVar42);
                    }
                  }
                  else if (iVar32 == 0x10 && bpc == 0x10) {
                    if (0 < (int)uVar41) {
                      sVar26 = -(ushort)(uVar37 == 3);
                      uVar43 = 0;
                      do {
                        auVar55._8_4_ = (int)uVar43;
                        auVar55._0_8_ = uVar43;
                        auVar55._12_4_ = (int)(uVar43 >> 0x20);
                        auVar62 = auVar58 ^ auVar142;
                        auVar143 = (auVar55 | _DAT_001420e0) ^ auVar142;
                        iVar27 = auVar62._0_4_;
                        iVar131 = -(uint)(iVar27 < auVar143._0_4_);
                        iVar30 = auVar62._4_4_;
                        auVar81._4_4_ = -(uint)(iVar30 < auVar143._4_4_);
                        iVar33 = auVar62._8_4_;
                        iVar132 = -(uint)(iVar33 < auVar143._8_4_);
                        iVar122 = auVar62._12_4_;
                        auVar81._12_4_ = -(uint)(iVar122 < auVar143._12_4_);
                        auVar110._4_4_ = iVar131;
                        auVar110._0_4_ = iVar131;
                        auVar110._8_4_ = iVar132;
                        auVar110._12_4_ = iVar132;
                        auVar62 = pshuflw(in_XMM5,auVar110,0xe8);
                        auVar80._4_4_ = -(uint)(auVar143._4_4_ == iVar30);
                        auVar80._12_4_ = -(uint)(auVar143._12_4_ == iVar122);
                        auVar80._0_4_ = auVar80._4_4_;
                        auVar80._8_4_ = auVar80._12_4_;
                        auVar66 = pshuflw(in_XMM6,auVar80,0xe8);
                        auVar81._0_4_ = auVar81._4_4_;
                        auVar81._8_4_ = auVar81._12_4_;
                        auVar143 = pshuflw(auVar62,auVar81,0xe8);
                        auVar137._8_4_ = 0xffffffff;
                        auVar137._0_8_ = 0xffffffffffffffff;
                        auVar137._12_4_ = 0xffffffff;
                        auVar137 = (auVar143 | auVar66 & auVar62) ^ auVar137;
                        auVar143 = packssdw(auVar137,auVar137);
                        if ((auVar143 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          psVar49[uVar43 * 4 + -0x1c] = sVar26;
                        }
                        auVar81 = auVar80 & auVar110 | auVar81;
                        auVar143 = packssdw(auVar81,auVar81);
                        auVar13._8_4_ = 0xffffffff;
                        auVar13._0_8_ = 0xffffffffffffffff;
                        auVar13._12_4_ = 0xffffffff;
                        auVar143 = packssdw(auVar143 ^ auVar13,auVar143 ^ auVar13);
                        if ((auVar143._0_4_ >> 0x10 & 1) != 0) {
                          psVar49[uVar43 * 4 + -0x18] = sVar26;
                        }
                        auVar143 = (auVar55 | _DAT_001420d0) ^ auVar142;
                        iVar131 = -(uint)(iVar27 < auVar143._0_4_);
                        auVar127._4_4_ = -(uint)(iVar30 < auVar143._4_4_);
                        iVar132 = -(uint)(iVar33 < auVar143._8_4_);
                        auVar127._12_4_ = -(uint)(iVar122 < auVar143._12_4_);
                        auVar82._4_4_ = iVar131;
                        auVar82._0_4_ = iVar131;
                        auVar82._8_4_ = iVar132;
                        auVar82._12_4_ = iVar132;
                        auVar111._4_4_ = -(uint)(auVar143._4_4_ == iVar30);
                        auVar111._12_4_ = -(uint)(auVar143._12_4_ == iVar122);
                        auVar111._0_4_ = auVar111._4_4_;
                        auVar111._8_4_ = auVar111._12_4_;
                        auVar127._0_4_ = auVar127._4_4_;
                        auVar127._8_4_ = auVar127._12_4_;
                        auVar143 = auVar111 & auVar82 | auVar127;
                        auVar143 = packssdw(auVar143,auVar143);
                        auVar14._8_4_ = 0xffffffff;
                        auVar14._0_8_ = 0xffffffffffffffff;
                        auVar14._12_4_ = 0xffffffff;
                        auVar143 = packssdw(auVar143 ^ auVar14,auVar143 ^ auVar14);
                        if ((auVar143 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          psVar49[uVar43 * 4 + -0x14] = sVar26;
                        }
                        auVar67 = pshufhw(auVar82,auVar82,0x84);
                        auVar112 = pshufhw(auVar111,auVar111,0x84);
                        auVar103 = pshufhw(auVar67,auVar127,0x84);
                        auVar83._8_4_ = 0xffffffff;
                        auVar83._0_8_ = 0xffffffffffffffff;
                        auVar83._12_4_ = 0xffffffff;
                        auVar83 = (auVar103 | auVar112 & auVar67) ^ auVar83;
                        auVar67 = packssdw(auVar83,auVar83);
                        if ((auVar67 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          psVar49[uVar43 * 4 + -0x10] = sVar26;
                        }
                        auVar67 = (auVar55 | _DAT_001420c0) ^ auVar142;
                        iVar131 = -(uint)(iVar27 < auVar67._0_4_);
                        auVar85._4_4_ = -(uint)(iVar30 < auVar67._4_4_);
                        iVar132 = -(uint)(iVar33 < auVar67._8_4_);
                        auVar85._12_4_ = -(uint)(iVar122 < auVar67._12_4_);
                        auVar113._4_4_ = iVar131;
                        auVar113._0_4_ = iVar131;
                        auVar113._8_4_ = iVar132;
                        auVar113._12_4_ = iVar132;
                        auVar143 = pshuflw(auVar143,auVar113,0xe8);
                        auVar84._4_4_ = -(uint)(auVar67._4_4_ == iVar30);
                        auVar84._12_4_ = -(uint)(auVar67._12_4_ == iVar122);
                        auVar84._0_4_ = auVar84._4_4_;
                        auVar84._8_4_ = auVar84._12_4_;
                        in_XMM6 = pshuflw(auVar66 & auVar62,auVar84,0xe8);
                        in_XMM6 = in_XMM6 & auVar143;
                        auVar85._0_4_ = auVar85._4_4_;
                        auVar85._8_4_ = auVar85._12_4_;
                        auVar62 = pshuflw(auVar143,auVar85,0xe8);
                        auVar138._8_4_ = 0xffffffff;
                        auVar138._0_8_ = 0xffffffffffffffff;
                        auVar138._12_4_ = 0xffffffff;
                        auVar138 = (auVar62 | in_XMM6) ^ auVar138;
                        in_XMM5 = packssdw(auVar138,auVar138);
                        if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          psVar49[uVar43 * 4 + -0xc] = sVar26;
                        }
                        auVar85 = auVar84 & auVar113 | auVar85;
                        auVar62 = packssdw(auVar85,auVar85);
                        auVar15._8_4_ = 0xffffffff;
                        auVar15._0_8_ = 0xffffffffffffffff;
                        auVar15._12_4_ = 0xffffffff;
                        auVar62 = packssdw(auVar62 ^ auVar15,auVar62 ^ auVar15);
                        if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          psVar49[uVar43 * 4 + -8] = sVar26;
                        }
                        auVar62 = (auVar55 | _DAT_001420b0) ^ auVar142;
                        auVar114._0_4_ = -(uint)(iVar27 < auVar62._0_4_);
                        auVar114._4_4_ = -(uint)(iVar30 < auVar62._4_4_);
                        auVar114._8_4_ = -(uint)(iVar33 < auVar62._8_4_);
                        auVar114._12_4_ = -(uint)(iVar122 < auVar62._12_4_);
                        auVar86._4_4_ = auVar114._0_4_;
                        auVar86._0_4_ = auVar114._0_4_;
                        auVar86._8_4_ = auVar114._8_4_;
                        auVar86._12_4_ = auVar114._8_4_;
                        auVar56._4_4_ = -(uint)(auVar62._4_4_ == iVar30);
                        auVar56._12_4_ = -(uint)(auVar62._12_4_ == iVar122);
                        auVar56._0_4_ = auVar56._4_4_;
                        auVar56._8_4_ = auVar56._12_4_;
                        auVar60._4_4_ = auVar114._4_4_;
                        auVar60._0_4_ = auVar114._4_4_;
                        auVar60._8_4_ = auVar114._12_4_;
                        auVar60._12_4_ = auVar114._12_4_;
                        auVar62 = packssdw(auVar114,auVar56 & auVar86 | auVar60);
                        auVar16._8_4_ = 0xffffffff;
                        auVar16._0_8_ = 0xffffffffffffffff;
                        auVar16._12_4_ = 0xffffffff;
                        auVar62 = packssdw(auVar62 ^ auVar16,auVar62 ^ auVar16);
                        if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          psVar49[uVar43 * 4 + -4] = sVar26;
                        }
                        auVar66 = pshufhw(auVar86,auVar86,0x84);
                        auVar62 = pshufhw(auVar56,auVar56,0x84);
                        auVar143 = pshufhw(auVar60,auVar60,0x84);
                        auVar17._8_4_ = 0xffffffff;
                        auVar17._0_8_ = 0xffffffffffffffff;
                        auVar17._12_4_ = 0xffffffff;
                        auVar62 = packssdw(auVar62 & auVar66,
                                           (auVar143 | auVar62 & auVar66) ^ auVar17);
                        if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          psVar49[uVar43 * 4] = sVar26;
                        }
                        uVar43 = uVar43 + 8;
                      } while (((ulong)uVar34 + 7 & 0xfffffffffffffff8) != uVar43);
                    }
                  }
                  else if (0 < (int)uVar41) {
                    cVar25 = -(uVar37 == 3);
                    uVar43 = 0;
                    do {
                      auVar143._8_4_ = (int)uVar43;
                      auVar143._0_8_ = uVar43;
                      auVar143._12_4_ = (int)(uVar43 >> 0x20);
                      auVar62 = auVar58 ^ auVar142;
                      auVar66 = (auVar143 | _DAT_001420e0) ^ auVar142;
                      iVar27 = auVar62._0_4_;
                      iVar131 = -(uint)(iVar27 < auVar66._0_4_);
                      iVar30 = auVar62._4_4_;
                      auVar103._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
                      iVar33 = auVar62._8_4_;
                      iVar132 = -(uint)(iVar33 < auVar66._8_4_);
                      iVar122 = auVar62._12_4_;
                      auVar103._12_4_ = -(uint)(iVar122 < auVar66._12_4_);
                      auVar112._4_4_ = iVar131;
                      auVar112._0_4_ = iVar131;
                      auVar112._8_4_ = iVar132;
                      auVar112._12_4_ = iVar132;
                      auVar139 = pshuflw(in_XMM5,auVar112,0xe8);
                      auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
                      auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar122);
                      auVar67._0_4_ = auVar67._4_4_;
                      auVar67._8_4_ = auVar67._12_4_;
                      auVar144 = pshuflw(in_XMM6,auVar67,0xe8);
                      auVar103._0_4_ = auVar103._4_4_;
                      auVar103._8_4_ = auVar103._12_4_;
                      auVar66 = pshuflw(auVar139,auVar103,0xe8);
                      auVar62._8_4_ = 0xffffffff;
                      auVar62._0_8_ = 0xffffffffffffffff;
                      auVar62._12_4_ = 0xffffffff;
                      auVar62 = (auVar66 | auVar144 & auVar139) ^ auVar62;
                      auVar62 = packssdw(auVar62,auVar62);
                      if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x1e) = cVar25;
                      }
                      auVar103 = auVar67 & auVar112 | auVar103;
                      auVar62 = packssdw(auVar103,auVar103);
                      auVar66._8_4_ = 0xffffffff;
                      auVar66._0_8_ = 0xffffffffffffffff;
                      auVar66._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 ^ auVar66,auVar62 ^ auVar66);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62._0_4_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x1c) = cVar25;
                      }
                      auVar62 = (auVar143 | _DAT_001420d0) ^ auVar142;
                      iVar131 = -(uint)(iVar27 < auVar62._0_4_);
                      auVar128._4_4_ = -(uint)(iVar30 < auVar62._4_4_);
                      iVar132 = -(uint)(iVar33 < auVar62._8_4_);
                      auVar128._12_4_ = -(uint)(iVar122 < auVar62._12_4_);
                      auVar87._4_4_ = iVar131;
                      auVar87._0_4_ = iVar131;
                      auVar87._8_4_ = iVar132;
                      auVar87._12_4_ = iVar132;
                      auVar115._4_4_ = -(uint)(auVar62._4_4_ == iVar30);
                      auVar115._12_4_ = -(uint)(auVar62._12_4_ == iVar122);
                      auVar115._0_4_ = auVar115._4_4_;
                      auVar115._8_4_ = auVar115._12_4_;
                      auVar128._0_4_ = auVar128._4_4_;
                      auVar128._8_4_ = auVar128._12_4_;
                      auVar62 = auVar115 & auVar87 | auVar128;
                      auVar62 = packssdw(auVar62,auVar62);
                      auVar18._8_4_ = 0xffffffff;
                      auVar18._0_8_ = 0xffffffffffffffff;
                      auVar18._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 ^ auVar18,auVar62 ^ auVar18);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x1a) = cVar25;
                      }
                      auVar66 = pshufhw(auVar87,auVar87,0x84);
                      auVar103 = pshufhw(auVar115,auVar115,0x84);
                      auVar67 = pshufhw(auVar66,auVar128,0x84);
                      auVar88._8_4_ = 0xffffffff;
                      auVar88._0_8_ = 0xffffffffffffffff;
                      auVar88._12_4_ = 0xffffffff;
                      auVar88 = (auVar67 | auVar103 & auVar66) ^ auVar88;
                      auVar66 = packssdw(auVar88,auVar88);
                      auVar66 = packsswb(auVar66,auVar66);
                      if ((auVar66._0_4_ >> 0x18 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x18) = cVar25;
                      }
                      auVar66 = (auVar143 | _DAT_001420c0) ^ auVar142;
                      iVar131 = -(uint)(iVar27 < auVar66._0_4_);
                      auVar90._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
                      iVar132 = -(uint)(iVar33 < auVar66._8_4_);
                      auVar90._12_4_ = -(uint)(iVar122 < auVar66._12_4_);
                      auVar116._4_4_ = iVar131;
                      auVar116._0_4_ = iVar131;
                      auVar116._8_4_ = iVar132;
                      auVar116._12_4_ = iVar132;
                      auVar62 = pshuflw(auVar62,auVar116,0xe8);
                      auVar89._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
                      auVar89._12_4_ = -(uint)(auVar66._12_4_ == iVar122);
                      auVar89._0_4_ = auVar89._4_4_;
                      auVar89._8_4_ = auVar89._12_4_;
                      auVar67 = pshuflw(auVar144 & auVar139,auVar89,0xe8);
                      auVar90._0_4_ = auVar90._4_4_;
                      auVar90._8_4_ = auVar90._12_4_;
                      auVar66 = pshuflw(auVar62,auVar90,0xe8);
                      auVar139._8_4_ = 0xffffffff;
                      auVar139._0_8_ = 0xffffffffffffffff;
                      auVar139._12_4_ = 0xffffffff;
                      auVar139 = (auVar66 | auVar67 & auVar62) ^ auVar139;
                      auVar66 = packssdw(auVar139,auVar139);
                      auVar66 = packsswb(auVar66,auVar66);
                      if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x16) = cVar25;
                      }
                      auVar90 = auVar89 & auVar116 | auVar90;
                      auVar66 = packssdw(auVar90,auVar90);
                      auVar144._8_4_ = 0xffffffff;
                      auVar144._0_8_ = 0xffffffffffffffff;
                      auVar144._12_4_ = 0xffffffff;
                      auVar66 = packssdw(auVar66 ^ auVar144,auVar66 ^ auVar144);
                      auVar66 = packsswb(auVar66,auVar66);
                      if ((auVar66._4_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x14) = cVar25;
                      }
                      auVar66 = (auVar143 | _DAT_001420b0) ^ auVar142;
                      iVar131 = -(uint)(iVar27 < auVar66._0_4_);
                      auVar129._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
                      iVar132 = -(uint)(iVar33 < auVar66._8_4_);
                      auVar129._12_4_ = -(uint)(iVar122 < auVar66._12_4_);
                      auVar91._4_4_ = iVar131;
                      auVar91._0_4_ = iVar131;
                      auVar91._8_4_ = iVar132;
                      auVar91._12_4_ = iVar132;
                      auVar117._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
                      auVar117._12_4_ = -(uint)(auVar66._12_4_ == iVar122);
                      auVar117._0_4_ = auVar117._4_4_;
                      auVar117._8_4_ = auVar117._12_4_;
                      auVar129._0_4_ = auVar129._4_4_;
                      auVar129._8_4_ = auVar129._12_4_;
                      auVar66 = auVar117 & auVar91 | auVar129;
                      auVar66 = packssdw(auVar66,auVar66);
                      auVar19._8_4_ = 0xffffffff;
                      auVar19._0_8_ = 0xffffffffffffffff;
                      auVar19._12_4_ = 0xffffffff;
                      auVar66 = packssdw(auVar66 ^ auVar19,auVar66 ^ auVar19);
                      auVar66 = packsswb(auVar66,auVar66);
                      if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x12) = cVar25;
                      }
                      auVar103 = pshufhw(auVar91,auVar91,0x84);
                      auVar139 = pshufhw(auVar117,auVar117,0x84);
                      auVar112 = pshufhw(auVar103,auVar129,0x84);
                      auVar92._8_4_ = 0xffffffff;
                      auVar92._0_8_ = 0xffffffffffffffff;
                      auVar92._12_4_ = 0xffffffff;
                      auVar92 = (auVar112 | auVar139 & auVar103) ^ auVar92;
                      auVar103 = packssdw(auVar92,auVar92);
                      auVar103 = packsswb(auVar103,auVar103);
                      if ((auVar103._6_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x10) = cVar25;
                      }
                      auVar103 = (auVar143 | _DAT_001420a0) ^ auVar142;
                      iVar131 = -(uint)(iVar27 < auVar103._0_4_);
                      auVar94._4_4_ = -(uint)(iVar30 < auVar103._4_4_);
                      iVar132 = -(uint)(iVar33 < auVar103._8_4_);
                      auVar94._12_4_ = -(uint)(iVar122 < auVar103._12_4_);
                      auVar118._4_4_ = iVar131;
                      auVar118._0_4_ = iVar131;
                      auVar118._8_4_ = iVar132;
                      auVar118._12_4_ = iVar132;
                      auVar66 = pshuflw(auVar66,auVar118,0xe8);
                      auVar93._4_4_ = -(uint)(auVar103._4_4_ == iVar30);
                      auVar93._12_4_ = -(uint)(auVar103._12_4_ == iVar122);
                      auVar93._0_4_ = auVar93._4_4_;
                      auVar93._8_4_ = auVar93._12_4_;
                      auVar67 = pshuflw(auVar67 & auVar62,auVar93,0xe8);
                      auVar94._0_4_ = auVar94._4_4_;
                      auVar94._8_4_ = auVar94._12_4_;
                      auVar62 = pshuflw(auVar66,auVar94,0xe8);
                      auVar140._8_4_ = 0xffffffff;
                      auVar140._0_8_ = 0xffffffffffffffff;
                      auVar140._12_4_ = 0xffffffff;
                      auVar140 = (auVar62 | auVar67 & auVar66) ^ auVar140;
                      auVar62 = packssdw(auVar140,auVar140);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0xe) = cVar25;
                      }
                      auVar94 = auVar93 & auVar118 | auVar94;
                      auVar62 = packssdw(auVar94,auVar94);
                      auVar20._8_4_ = 0xffffffff;
                      auVar20._0_8_ = 0xffffffffffffffff;
                      auVar20._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 ^ auVar20,auVar62 ^ auVar20);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62._8_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0xc) = cVar25;
                      }
                      auVar62 = (auVar143 | _DAT_00142090) ^ auVar142;
                      iVar131 = -(uint)(iVar27 < auVar62._0_4_);
                      auVar130._4_4_ = -(uint)(iVar30 < auVar62._4_4_);
                      iVar132 = -(uint)(iVar33 < auVar62._8_4_);
                      auVar130._12_4_ = -(uint)(iVar122 < auVar62._12_4_);
                      auVar95._4_4_ = iVar131;
                      auVar95._0_4_ = iVar131;
                      auVar95._8_4_ = iVar132;
                      auVar95._12_4_ = iVar132;
                      auVar119._4_4_ = -(uint)(auVar62._4_4_ == iVar30);
                      auVar119._12_4_ = -(uint)(auVar62._12_4_ == iVar122);
                      auVar119._0_4_ = auVar119._4_4_;
                      auVar119._8_4_ = auVar119._12_4_;
                      auVar130._0_4_ = auVar130._4_4_;
                      auVar130._8_4_ = auVar130._12_4_;
                      auVar62 = auVar119 & auVar95 | auVar130;
                      auVar62 = packssdw(auVar62,auVar62);
                      auVar21._8_4_ = 0xffffffff;
                      auVar21._0_8_ = 0xffffffffffffffff;
                      auVar21._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 ^ auVar21,auVar62 ^ auVar21);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -10) = cVar25;
                      }
                      auVar103 = pshufhw(auVar95,auVar95,0x84);
                      auVar139 = pshufhw(auVar119,auVar119,0x84);
                      auVar112 = pshufhw(auVar103,auVar130,0x84);
                      auVar96._8_4_ = 0xffffffff;
                      auVar96._0_8_ = 0xffffffffffffffff;
                      auVar96._12_4_ = 0xffffffff;
                      auVar96 = (auVar112 | auVar139 & auVar103) ^ auVar96;
                      auVar103 = packssdw(auVar96,auVar96);
                      auVar103 = packsswb(auVar103,auVar103);
                      if ((auVar103._10_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -8) = cVar25;
                      }
                      auVar103 = (auVar143 | _DAT_00142080) ^ auVar142;
                      iVar131 = -(uint)(iVar27 < auVar103._0_4_);
                      auVar98._4_4_ = -(uint)(iVar30 < auVar103._4_4_);
                      iVar132 = -(uint)(iVar33 < auVar103._8_4_);
                      auVar98._12_4_ = -(uint)(iVar122 < auVar103._12_4_);
                      auVar120._4_4_ = iVar131;
                      auVar120._0_4_ = iVar131;
                      auVar120._8_4_ = iVar132;
                      auVar120._12_4_ = iVar132;
                      auVar62 = pshuflw(auVar62,auVar120,0xe8);
                      auVar97._4_4_ = -(uint)(auVar103._4_4_ == iVar30);
                      auVar97._12_4_ = -(uint)(auVar103._12_4_ == iVar122);
                      auVar97._0_4_ = auVar97._4_4_;
                      auVar97._8_4_ = auVar97._12_4_;
                      in_XMM6 = pshuflw(auVar67 & auVar66,auVar97,0xe8);
                      in_XMM6 = in_XMM6 & auVar62;
                      auVar98._0_4_ = auVar98._4_4_;
                      auVar98._8_4_ = auVar98._12_4_;
                      auVar62 = pshuflw(auVar62,auVar98,0xe8);
                      auVar141._8_4_ = 0xffffffff;
                      auVar141._0_8_ = 0xffffffffffffffff;
                      auVar141._12_4_ = 0xffffffff;
                      auVar141 = (auVar62 | in_XMM6) ^ auVar141;
                      auVar62 = packssdw(auVar141,auVar141);
                      in_XMM5 = packsswb(auVar62,auVar62);
                      if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -6) = cVar25;
                      }
                      auVar98 = auVar97 & auVar120 | auVar98;
                      auVar62 = packssdw(auVar98,auVar98);
                      auVar22._8_4_ = 0xffffffff;
                      auVar22._0_8_ = 0xffffffffffffffff;
                      auVar22._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 ^ auVar22,auVar62 ^ auVar22);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62._12_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -4) = cVar25;
                      }
                      auVar62 = (auVar143 | _DAT_00142070) ^ auVar142;
                      auVar121._0_4_ = -(uint)(iVar27 < auVar62._0_4_);
                      auVar121._4_4_ = -(uint)(iVar30 < auVar62._4_4_);
                      auVar121._8_4_ = -(uint)(iVar33 < auVar62._8_4_);
                      auVar121._12_4_ = -(uint)(iVar122 < auVar62._12_4_);
                      auVar99._4_4_ = auVar121._0_4_;
                      auVar99._0_4_ = auVar121._0_4_;
                      auVar99._8_4_ = auVar121._8_4_;
                      auVar99._12_4_ = auVar121._8_4_;
                      auVar57._4_4_ = -(uint)(auVar62._4_4_ == iVar30);
                      auVar57._12_4_ = -(uint)(auVar62._12_4_ == iVar122);
                      auVar57._0_4_ = auVar57._4_4_;
                      auVar57._8_4_ = auVar57._12_4_;
                      auVar61._4_4_ = auVar121._4_4_;
                      auVar61._0_4_ = auVar121._4_4_;
                      auVar61._8_4_ = auVar121._12_4_;
                      auVar61._12_4_ = auVar121._12_4_;
                      auVar62 = packssdw(auVar121,auVar57 & auVar99 | auVar61);
                      auVar23._8_4_ = 0xffffffff;
                      auVar23._0_8_ = 0xffffffffffffffff;
                      auVar23._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 ^ auVar23,auVar62 ^ auVar23);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -2) = cVar25;
                      }
                      auVar66 = pshufhw(auVar99,auVar99,0x84);
                      auVar62 = pshufhw(auVar57,auVar57,0x84);
                      auVar143 = pshufhw(auVar61,auVar61,0x84);
                      auVar24._8_4_ = 0xffffffff;
                      auVar24._0_8_ = 0xffffffffffffffff;
                      auVar24._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 & auVar66,(auVar143 | auVar62 & auVar66) ^ auVar24)
                      ;
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62._14_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2) = cVar25;
                      }
                      uVar43 = uVar43 + 0x10;
                    } while (((ulong)uVar34 + 0xf & 0xfffffffffffffff0) != uVar43);
                  }
                  uVar37 = uVar37 + 1;
                  psVar46 = (stbi__uint16 *)((long)psVar46 + 1);
                  psVar49 = psVar49 + 1;
                  psVar47 = (stbi__uint16 *)((long)psVar47 + 1);
                  local_68 = local_68 + 1;
                } while (uVar37 != 4);
              }
              else {
                stbi__skip(s,uVar28 * y_00 * 2);
                psVar35 = s->buffer_start;
                psVar1 = s->buffer_start + 1;
                lVar42 = (ulong)((uVar29 | uVar39) * (uVar31 | uVar40)) - 1;
                auVar52._8_4_ = (int)lVar42;
                auVar52._0_8_ = lVar42;
                auVar52._12_4_ = (int)((ulong)lVar42 >> 0x20);
                psVar46 = data + 0x1e;
                uVar37 = 0;
                auVar142 = _DAT_001420f0;
                do {
                  if (uVar37 < uVar28) {
                    if (0 < (int)uVar41) {
                      pbVar48 = (byte *)((long)data + uVar37);
                      iVar27 = 0;
                      uVar34 = uVar41;
                      do {
                        pbVar3 = s->img_buffer;
                        psVar36 = s->img_buffer_end;
                        if (pbVar3 < psVar36) {
                          s->img_buffer = pbVar3 + 1;
                          bVar44 = *pbVar3;
                          psVar38 = pbVar3 + 1;
LAB_00112428:
                          if (bVar44 != 0x80) {
                            uVar50 = (uint)bVar44;
                            if (-1 < (char)bVar44) {
                              if (uVar34 <= bVar44) {
LAB_00112a50:
                                free(data);
                                stbi__g_failure_reason = "corrupt";
                                return (void *)0x0;
                              }
                              goto LAB_0011244b;
                            }
                            uVar51 = 0x101 - uVar50;
                            if (uVar34 < uVar51) goto LAB_00112a50;
                            if (psVar38 < psVar36) {
                              s->img_buffer = psVar38 + 1;
                              bVar44 = *psVar38;
                            }
                            else if (s->read_from_callbacks == 0) {
                              bVar44 = 0;
                            }
                            else {
                              iVar30 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                              if (iVar30 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                bVar44 = 0;
                                psVar36 = psVar1;
                              }
                              else {
                                bVar44 = *psVar35;
                                psVar36 = psVar35 + iVar30;
                              }
                              auVar142 = _DAT_001420f0;
                              s->img_buffer_end = psVar36;
                              s->img_buffer = psVar1;
                            }
                            iVar30 = uVar50 - 0x101;
                            do {
                              *pbVar48 = bVar44;
                              pbVar48 = pbVar48 + 4;
                              iVar30 = iVar30 + 1;
                            } while (iVar30 != 0);
                            goto LAB_0011259b;
                          }
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar30 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                            if (iVar30 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar44 = 0;
                              psVar36 = psVar1;
                            }
                            else {
                              bVar44 = *psVar35;
                              psVar36 = psVar35 + iVar30;
                            }
                            s->img_buffer_end = psVar36;
                            s->img_buffer = psVar1;
                            psVar38 = psVar1;
                            auVar142 = _DAT_001420f0;
                            goto LAB_00112428;
                          }
                          uVar50 = 0;
LAB_0011244b:
                          uVar51 = uVar50 + 1;
                          uVar34 = uVar51;
                          do {
                            pbVar3 = s->img_buffer;
                            if (pbVar3 < s->img_buffer_end) {
                              s->img_buffer = pbVar3 + 1;
                              bVar44 = *pbVar3;
                            }
                            else if (s->read_from_callbacks == 0) {
                              bVar44 = 0;
                            }
                            else {
                              iVar30 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                              if (iVar30 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                bVar44 = 0;
                                psVar36 = psVar1;
                              }
                              else {
                                bVar44 = *psVar35;
                                psVar36 = psVar35 + iVar30;
                              }
                              auVar142 = _DAT_001420f0;
                              s->img_buffer_end = psVar36;
                              s->img_buffer = psVar1;
                            }
                            *pbVar48 = bVar44;
                            pbVar48 = pbVar48 + 4;
                            uVar34 = uVar34 - 1;
                          } while (uVar34 != 0);
LAB_0011259b:
                          iVar27 = iVar27 + uVar51;
                        }
                        uVar34 = uVar41 - iVar27;
                      } while (uVar34 != 0 && iVar27 <= (int)uVar41);
                    }
                  }
                  else if (0 < (int)uVar41) {
                    cVar25 = -(uVar37 == 3);
                    uVar43 = 0;
                    do {
                      auVar53._8_4_ = (int)uVar43;
                      auVar53._0_8_ = uVar43;
                      auVar53._12_4_ = (int)(uVar43 >> 0x20);
                      auVar58 = auVar52 ^ auVar142;
                      auVar62 = (auVar53 | _DAT_001420e0) ^ auVar142;
                      iVar27 = auVar58._0_4_;
                      iVar122 = -(uint)(iVar27 < auVar62._0_4_);
                      iVar30 = auVar58._4_4_;
                      auVar64._4_4_ = -(uint)(iVar30 < auVar62._4_4_);
                      iVar32 = auVar58._8_4_;
                      iVar131 = -(uint)(iVar32 < auVar62._8_4_);
                      iVar33 = auVar58._12_4_;
                      auVar64._12_4_ = -(uint)(iVar33 < auVar62._12_4_);
                      auVar101._4_4_ = iVar122;
                      auVar101._0_4_ = iVar122;
                      auVar101._8_4_ = iVar131;
                      auVar101._12_4_ = iVar131;
                      auVar58 = pshuflw(in_XMM5,auVar101,0xe8);
                      auVar63._4_4_ = -(uint)(auVar62._4_4_ == iVar30);
                      auVar63._12_4_ = -(uint)(auVar62._12_4_ == iVar33);
                      auVar63._0_4_ = auVar63._4_4_;
                      auVar63._8_4_ = auVar63._12_4_;
                      auVar143 = pshuflw(in_XMM6,auVar63,0xe8);
                      auVar64._0_4_ = auVar64._4_4_;
                      auVar64._8_4_ = auVar64._12_4_;
                      auVar62 = pshuflw(auVar58,auVar64,0xe8);
                      auVar133._8_4_ = 0xffffffff;
                      auVar133._0_8_ = 0xffffffffffffffff;
                      auVar133._12_4_ = 0xffffffff;
                      auVar133 = (auVar62 | auVar143 & auVar58) ^ auVar133;
                      auVar62 = packssdw(auVar133,auVar133);
                      if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x1e) = cVar25;
                      }
                      auVar64 = auVar63 & auVar101 | auVar64;
                      auVar62 = packssdw(auVar64,auVar64);
                      auVar4._8_4_ = 0xffffffff;
                      auVar4._0_8_ = 0xffffffffffffffff;
                      auVar4._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 ^ auVar4,auVar62 ^ auVar4);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62._0_4_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x1c) = cVar25;
                      }
                      auVar62 = (auVar53 | _DAT_001420d0) ^ auVar142;
                      iVar122 = -(uint)(iVar27 < auVar62._0_4_);
                      auVar124._4_4_ = -(uint)(iVar30 < auVar62._4_4_);
                      iVar131 = -(uint)(iVar32 < auVar62._8_4_);
                      auVar124._12_4_ = -(uint)(iVar33 < auVar62._12_4_);
                      auVar65._4_4_ = iVar122;
                      auVar65._0_4_ = iVar122;
                      auVar65._8_4_ = iVar131;
                      auVar65._12_4_ = iVar131;
                      auVar102._4_4_ = -(uint)(auVar62._4_4_ == iVar30);
                      auVar102._12_4_ = -(uint)(auVar62._12_4_ == iVar33);
                      auVar102._0_4_ = auVar102._4_4_;
                      auVar102._8_4_ = auVar102._12_4_;
                      auVar124._0_4_ = auVar124._4_4_;
                      auVar124._8_4_ = auVar124._12_4_;
                      auVar62 = auVar102 & auVar65 | auVar124;
                      auVar62 = packssdw(auVar62,auVar62);
                      auVar5._8_4_ = 0xffffffff;
                      auVar5._0_8_ = 0xffffffffffffffff;
                      auVar5._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 ^ auVar5,auVar62 ^ auVar5);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x1a) = cVar25;
                      }
                      auVar66 = pshufhw(auVar65,auVar65,0x84);
                      auVar103 = pshufhw(auVar102,auVar102,0x84);
                      auVar67 = pshufhw(auVar66,auVar124,0x84);
                      auVar68._8_4_ = 0xffffffff;
                      auVar68._0_8_ = 0xffffffffffffffff;
                      auVar68._12_4_ = 0xffffffff;
                      auVar68 = (auVar67 | auVar103 & auVar66) ^ auVar68;
                      auVar66 = packssdw(auVar68,auVar68);
                      auVar66 = packsswb(auVar66,auVar66);
                      if ((auVar66._0_4_ >> 0x18 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x18) = cVar25;
                      }
                      auVar66 = (auVar53 | _DAT_001420c0) ^ auVar142;
                      iVar122 = -(uint)(iVar27 < auVar66._0_4_);
                      auVar70._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
                      iVar131 = -(uint)(iVar32 < auVar66._8_4_);
                      auVar70._12_4_ = -(uint)(iVar33 < auVar66._12_4_);
                      auVar104._4_4_ = iVar122;
                      auVar104._0_4_ = iVar122;
                      auVar104._8_4_ = iVar131;
                      auVar104._12_4_ = iVar131;
                      auVar62 = pshuflw(auVar62,auVar104,0xe8);
                      auVar69._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
                      auVar69._12_4_ = -(uint)(auVar66._12_4_ == iVar33);
                      auVar69._0_4_ = auVar69._4_4_;
                      auVar69._8_4_ = auVar69._12_4_;
                      auVar143 = pshuflw(auVar143 & auVar58,auVar69,0xe8);
                      auVar70._0_4_ = auVar70._4_4_;
                      auVar70._8_4_ = auVar70._12_4_;
                      auVar58 = pshuflw(auVar62,auVar70,0xe8);
                      auVar134._8_4_ = 0xffffffff;
                      auVar134._0_8_ = 0xffffffffffffffff;
                      auVar134._12_4_ = 0xffffffff;
                      auVar134 = (auVar58 | auVar143 & auVar62) ^ auVar134;
                      auVar58 = packssdw(auVar134,auVar134);
                      auVar58 = packsswb(auVar58,auVar58);
                      if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x16) = cVar25;
                      }
                      auVar70 = auVar69 & auVar104 | auVar70;
                      auVar58 = packssdw(auVar70,auVar70);
                      auVar6._8_4_ = 0xffffffff;
                      auVar6._0_8_ = 0xffffffffffffffff;
                      auVar6._12_4_ = 0xffffffff;
                      auVar58 = packssdw(auVar58 ^ auVar6,auVar58 ^ auVar6);
                      auVar58 = packsswb(auVar58,auVar58);
                      if ((auVar58._4_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x14) = cVar25;
                      }
                      auVar58 = (auVar53 | _DAT_001420b0) ^ auVar142;
                      iVar122 = -(uint)(iVar27 < auVar58._0_4_);
                      auVar125._4_4_ = -(uint)(iVar30 < auVar58._4_4_);
                      iVar131 = -(uint)(iVar32 < auVar58._8_4_);
                      auVar125._12_4_ = -(uint)(iVar33 < auVar58._12_4_);
                      auVar71._4_4_ = iVar122;
                      auVar71._0_4_ = iVar122;
                      auVar71._8_4_ = iVar131;
                      auVar71._12_4_ = iVar131;
                      auVar105._4_4_ = -(uint)(auVar58._4_4_ == iVar30);
                      auVar105._12_4_ = -(uint)(auVar58._12_4_ == iVar33);
                      auVar105._0_4_ = auVar105._4_4_;
                      auVar105._8_4_ = auVar105._12_4_;
                      auVar125._0_4_ = auVar125._4_4_;
                      auVar125._8_4_ = auVar125._12_4_;
                      auVar58 = auVar105 & auVar71 | auVar125;
                      auVar58 = packssdw(auVar58,auVar58);
                      auVar7._8_4_ = 0xffffffff;
                      auVar7._0_8_ = 0xffffffffffffffff;
                      auVar7._12_4_ = 0xffffffff;
                      auVar58 = packssdw(auVar58 ^ auVar7,auVar58 ^ auVar7);
                      auVar58 = packsswb(auVar58,auVar58);
                      if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x12) = cVar25;
                      }
                      auVar66 = pshufhw(auVar71,auVar71,0x84);
                      auVar103 = pshufhw(auVar105,auVar105,0x84);
                      auVar67 = pshufhw(auVar66,auVar125,0x84);
                      auVar72._8_4_ = 0xffffffff;
                      auVar72._0_8_ = 0xffffffffffffffff;
                      auVar72._12_4_ = 0xffffffff;
                      auVar72 = (auVar67 | auVar103 & auVar66) ^ auVar72;
                      auVar66 = packssdw(auVar72,auVar72);
                      auVar66 = packsswb(auVar66,auVar66);
                      if ((auVar66._6_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0x10) = cVar25;
                      }
                      auVar66 = (auVar53 | _DAT_001420a0) ^ auVar142;
                      iVar122 = -(uint)(iVar27 < auVar66._0_4_);
                      auVar74._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
                      iVar131 = -(uint)(iVar32 < auVar66._8_4_);
                      auVar74._12_4_ = -(uint)(iVar33 < auVar66._12_4_);
                      auVar106._4_4_ = iVar122;
                      auVar106._0_4_ = iVar122;
                      auVar106._8_4_ = iVar131;
                      auVar106._12_4_ = iVar131;
                      auVar58 = pshuflw(auVar58,auVar106,0xe8);
                      auVar73._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
                      auVar73._12_4_ = -(uint)(auVar66._12_4_ == iVar33);
                      auVar73._0_4_ = auVar73._4_4_;
                      auVar73._8_4_ = auVar73._12_4_;
                      auVar143 = pshuflw(auVar143 & auVar62,auVar73,0xe8);
                      auVar74._0_4_ = auVar74._4_4_;
                      auVar74._8_4_ = auVar74._12_4_;
                      auVar62 = pshuflw(auVar58,auVar74,0xe8);
                      auVar135._8_4_ = 0xffffffff;
                      auVar135._0_8_ = 0xffffffffffffffff;
                      auVar135._12_4_ = 0xffffffff;
                      auVar135 = (auVar62 | auVar143 & auVar58) ^ auVar135;
                      auVar62 = packssdw(auVar135,auVar135);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0xe) = cVar25;
                      }
                      auVar74 = auVar73 & auVar106 | auVar74;
                      auVar62 = packssdw(auVar74,auVar74);
                      auVar8._8_4_ = 0xffffffff;
                      auVar8._0_8_ = 0xffffffffffffffff;
                      auVar8._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 ^ auVar8,auVar62 ^ auVar8);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62._8_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -0xc) = cVar25;
                      }
                      auVar62 = (auVar53 | _DAT_00142090) ^ auVar142;
                      iVar122 = -(uint)(iVar27 < auVar62._0_4_);
                      auVar126._4_4_ = -(uint)(iVar30 < auVar62._4_4_);
                      iVar131 = -(uint)(iVar32 < auVar62._8_4_);
                      auVar126._12_4_ = -(uint)(iVar33 < auVar62._12_4_);
                      auVar75._4_4_ = iVar122;
                      auVar75._0_4_ = iVar122;
                      auVar75._8_4_ = iVar131;
                      auVar75._12_4_ = iVar131;
                      auVar107._4_4_ = -(uint)(auVar62._4_4_ == iVar30);
                      auVar107._12_4_ = -(uint)(auVar62._12_4_ == iVar33);
                      auVar107._0_4_ = auVar107._4_4_;
                      auVar107._8_4_ = auVar107._12_4_;
                      auVar126._0_4_ = auVar126._4_4_;
                      auVar126._8_4_ = auVar126._12_4_;
                      auVar62 = auVar107 & auVar75 | auVar126;
                      auVar62 = packssdw(auVar62,auVar62);
                      auVar9._8_4_ = 0xffffffff;
                      auVar9._0_8_ = 0xffffffffffffffff;
                      auVar9._12_4_ = 0xffffffff;
                      auVar62 = packssdw(auVar62 ^ auVar9,auVar62 ^ auVar9);
                      auVar62 = packsswb(auVar62,auVar62);
                      if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -10) = cVar25;
                      }
                      auVar66 = pshufhw(auVar75,auVar75,0x84);
                      auVar103 = pshufhw(auVar107,auVar107,0x84);
                      auVar67 = pshufhw(auVar66,auVar126,0x84);
                      auVar76._8_4_ = 0xffffffff;
                      auVar76._0_8_ = 0xffffffffffffffff;
                      auVar76._12_4_ = 0xffffffff;
                      auVar76 = (auVar67 | auVar103 & auVar66) ^ auVar76;
                      auVar66 = packssdw(auVar76,auVar76);
                      auVar66 = packsswb(auVar66,auVar66);
                      if ((auVar66._10_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -8) = cVar25;
                      }
                      auVar66 = (auVar53 | _DAT_00142080) ^ auVar142;
                      iVar122 = -(uint)(iVar27 < auVar66._0_4_);
                      auVar78._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
                      iVar131 = -(uint)(iVar32 < auVar66._8_4_);
                      auVar78._12_4_ = -(uint)(iVar33 < auVar66._12_4_);
                      auVar108._4_4_ = iVar122;
                      auVar108._0_4_ = iVar122;
                      auVar108._8_4_ = iVar131;
                      auVar108._12_4_ = iVar131;
                      auVar62 = pshuflw(auVar62,auVar108,0xe8);
                      auVar77._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
                      auVar77._12_4_ = -(uint)(auVar66._12_4_ == iVar33);
                      auVar77._0_4_ = auVar77._4_4_;
                      auVar77._8_4_ = auVar77._12_4_;
                      in_XMM6 = pshuflw(auVar143 & auVar58,auVar77,0xe8);
                      in_XMM6 = in_XMM6 & auVar62;
                      auVar78._0_4_ = auVar78._4_4_;
                      auVar78._8_4_ = auVar78._12_4_;
                      auVar58 = pshuflw(auVar62,auVar78,0xe8);
                      auVar136._8_4_ = 0xffffffff;
                      auVar136._0_8_ = 0xffffffffffffffff;
                      auVar136._12_4_ = 0xffffffff;
                      auVar136 = (auVar58 | in_XMM6) ^ auVar136;
                      auVar58 = packssdw(auVar136,auVar136);
                      in_XMM5 = packsswb(auVar58,auVar58);
                      if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -6) = cVar25;
                      }
                      auVar78 = auVar77 & auVar108 | auVar78;
                      auVar58 = packssdw(auVar78,auVar78);
                      auVar10._8_4_ = 0xffffffff;
                      auVar10._0_8_ = 0xffffffffffffffff;
                      auVar10._12_4_ = 0xffffffff;
                      auVar58 = packssdw(auVar58 ^ auVar10,auVar58 ^ auVar10);
                      auVar58 = packsswb(auVar58,auVar58);
                      if ((auVar58._12_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2 + -4) = cVar25;
                      }
                      auVar58 = (auVar53 | _DAT_00142070) ^ auVar142;
                      auVar109._0_4_ = -(uint)(iVar27 < auVar58._0_4_);
                      auVar109._4_4_ = -(uint)(iVar30 < auVar58._4_4_);
                      auVar109._8_4_ = -(uint)(iVar32 < auVar58._8_4_);
                      auVar109._12_4_ = -(uint)(iVar33 < auVar58._12_4_);
                      auVar79._4_4_ = auVar109._0_4_;
                      auVar79._0_4_ = auVar109._0_4_;
                      auVar79._8_4_ = auVar109._8_4_;
                      auVar79._12_4_ = auVar109._8_4_;
                      auVar54._4_4_ = -(uint)(auVar58._4_4_ == iVar30);
                      auVar54._12_4_ = -(uint)(auVar58._12_4_ == iVar33);
                      auVar54._0_4_ = auVar54._4_4_;
                      auVar54._8_4_ = auVar54._12_4_;
                      auVar59._4_4_ = auVar109._4_4_;
                      auVar59._0_4_ = auVar109._4_4_;
                      auVar59._8_4_ = auVar109._12_4_;
                      auVar59._12_4_ = auVar109._12_4_;
                      auVar58 = packssdw(auVar109,auVar54 & auVar79 | auVar59);
                      auVar11._8_4_ = 0xffffffff;
                      auVar11._0_8_ = 0xffffffffffffffff;
                      auVar11._12_4_ = 0xffffffff;
                      auVar58 = packssdw(auVar58 ^ auVar11,auVar58 ^ auVar11);
                      auVar58 = packsswb(auVar58,auVar58);
                      if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar46 + uVar43 * 2 + -2) = cVar25;
                      }
                      auVar143 = pshufhw(auVar79,auVar79,0x84);
                      auVar58 = pshufhw(auVar54,auVar54,0x84);
                      auVar62 = pshufhw(auVar59,auVar59,0x84);
                      auVar12._8_4_ = 0xffffffff;
                      auVar12._0_8_ = 0xffffffffffffffff;
                      auVar12._12_4_ = 0xffffffff;
                      auVar58 = packssdw(auVar58 & auVar143,(auVar62 | auVar58 & auVar143) ^ auVar12
                                        );
                      auVar58 = packsswb(auVar58,auVar58);
                      if ((auVar58._14_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar46 + uVar43 * 2) = cVar25;
                      }
                      uVar43 = uVar43 + 0x10;
                    } while (((ulong)((uVar29 + uVar39) * (uVar31 + uVar40)) + 0xf &
                             0xfffffffffffffff0) != uVar43);
                  }
                  uVar37 = uVar37 + 1;
                  psVar46 = (stbi__uint16 *)((long)psVar46 + 1);
                } while (uVar37 != 4);
              }
              if (3 < uVar28) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < (int)uVar41) {
                    uVar37 = 0;
                    do {
                      uVar2 = data[uVar37 * 4 + 3];
                      if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                        fVar123 = 1.0 / ((float)uVar2 / 65535.0);
                        fVar100 = (1.0 - fVar123) * 65535.0;
                        auVar142._0_4_ =
                             (int)(fVar100 +
                                  fVar123 * (float)(*(uint *)(data + uVar37 * 4) & 0xffff));
                        auVar142._4_4_ =
                             (int)(fVar100 + fVar123 * (float)(*(uint *)(data + uVar37 * 4) >> 0x10)
                                  );
                        auVar142._8_4_ = (int)(fVar100 + fVar123 * 0.0);
                        auVar142._12_4_ = (int)(fVar100 + fVar123 * 0.0);
                        auVar142 = pshuflw(auVar142,auVar142,0xe8);
                        *(int *)(data + uVar37 * 4) = auVar142._0_4_;
                        data[uVar37 * 4 + 2] =
                             (stbi__uint16)(int)((float)data[uVar37 * 4 + 2] * fVar123 + fVar100);
                      }
                      uVar37 = uVar37 + 1;
                    } while ((uVar29 + uVar39) * (uVar31 + uVar40) != uVar37);
                  }
                }
                else if (0 < (int)uVar41) {
                  uVar37 = 0;
                  do {
                    bVar44 = *(byte *)((long)data + uVar37 * 4 + 3);
                    if ((bVar44 != 0) && (bVar44 != 0xff)) {
                      fVar123 = 1.0 / ((float)bVar44 / 255.0);
                      fVar100 = (1.0 - fVar123) * 255.0;
                      *(char *)(data + uVar37 * 2) =
                           (char)(int)((float)(byte)data[uVar37 * 2] * fVar123 + fVar100);
                      *(char *)((long)data + uVar37 * 4 + 1) =
                           (char)(int)((float)*(byte *)((long)data + uVar37 * 4 + 1) * fVar123 +
                                      fVar100);
                      *(char *)(data + uVar37 * 2 + 1) =
                           (char)(int)((float)(byte)data[uVar37 * 2 + 1] * fVar123 + fVar100);
                    }
                    uVar37 = uVar37 + 1;
                  } while ((uVar29 + uVar39) * (uVar31 + uVar40) != uVar37);
                }
              }
              if ((req_comp & 0xfffffffbU) != 0) {
                if (ri->bits_per_channel == 0x10) {
                  data = stbi__convert_format16(data,4,req_comp,x_00,y_00);
                }
                else {
                  data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,y_00);
                }
                if (data == (stbi__uint16 *)0x0) {
                  return (void *)0x0;
                }
              }
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = y_00;
              *x = x_00;
              return data;
            }
            stbi__g_failure_reason = "outofmem";
          }
        }
        else {
          stbi__g_failure_reason = "bad compression";
        }
      }
      else {
        stbi__g_failure_reason = "wrong color format";
      }
    }
    else {
      stbi__g_failure_reason = "unsupported bit depth";
    }
  }
  else {
    stbi__g_failure_reason = "wrong channel count";
  }
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}